

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

TestPackedTypesLite *
google::protobuf::DynamicCastMessage<proto2_unittest::TestPackedTypesLite>(MessageLite *from)

{
  int iVar1;
  long lVar2;
  undefined4 extraout_var;
  TestPackedTypesLite *pTVar3;
  
  if (from != (MessageLite *)0x0) {
    lVar2 = (**(code **)(proto2_unittest::_TestPackedTypesLite_default_instance_ + 0x20))();
    iVar1 = (*from->_vptr_MessageLite[4])(from);
    pTVar3 = (TestPackedTypesLite *)0x0;
    if (lVar2 == CONCAT44(extraout_var,iVar1)) {
      pTVar3 = (TestPackedTypesLite *)from;
    }
    return pTVar3;
  }
  return (TestPackedTypesLite *)0x0;
}

Assistant:

const T* DynamicCastMessage(const MessageLite* from) {
  static_assert(std::is_base_of<MessageLite, T>::value, "");

  // We might avoid the call to T::GetClassData() altogether if T were to
  // expose the class data pointer.
  if (from == nullptr || TypeId::Get<T>() != TypeId::Get(*from)) {
    return nullptr;
  }

  return static_cast<const T*>(from);
}